

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int get_data_cache_size(int cpuid,int level)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  FILE *pFVar5;
  size_t sVar6;
  ulong uVar7;
  size_t __cpu;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  int thread_siblings;
  CpuSet shared_cpu_map;
  int cache_level;
  char path [256];
  uint local_2c4;
  int local_2c0;
  int local_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  int *local_228;
  char local_138 [264];
  
  local_2c0 = level;
  sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/level",cpuid,0);
  pFVar5 = fopen(local_138,"rb");
  if (pFVar5 != (FILE *)0x0) {
    uVar7 = 0;
    do {
      local_238._0_4_ = 0xffffffff;
      iVar3 = __isoc99_fscanf(pFVar5,"%d",local_238);
      fclose(pFVar5);
      if ((iVar3 == 1) && (local_238._0_4_ == local_2c0)) {
        sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/type",cpuid,uVar7);
        pFVar5 = fopen(local_138,"rb");
        if (pFVar5 == (FILE *)0x0) {
          return 0;
        }
        iVar3 = __isoc99_fscanf(pFVar5,"%31s",local_238);
        fclose(pFVar5);
        if (iVar3 == 1) {
          if ((local_238[4] == '\0' && local_238._0_4_ == 0x61746144) ||
             (local_238._0_8_ == 0x64656966696e55)) {
            local_2c4 = 0;
            sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/size",cpuid,uVar7);
            pFVar5 = fopen(local_138,"rb");
            if (pFVar5 == (FILE *)0x0) {
              return 0;
            }
            iVar3 = __isoc99_fscanf(pFVar5,"%dK",&local_2c4);
            fclose(pFVar5);
            if (iVar3 != 1) {
              get_data_cache_size();
              return 0;
            }
            local_248 = (undefined1  [16])0x0;
            local_258 = (undefined1  [16])0x0;
            local_268 = (undefined1  [16])0x0;
            local_278 = (undefined1  [16])0x0;
            local_288 = (undefined1  [16])0x0;
            local_298 = (undefined1  [16])0x0;
            local_2a8 = (undefined1  [16])0x0;
            local_2b8 = (undefined1  [16])0x0;
            sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map",cpuid,
                    uVar7);
            pFVar5 = fopen(local_138,"rb");
            if (pFVar5 == (FILE *)0x0) {
              return 0;
            }
            iVar3 = __isoc99_fscanf(pFVar5,"%255s",local_238);
            fclose(pFVar5);
            if (iVar3 != 1) {
              get_data_cache_size();
              return 0;
            }
            sVar6 = strlen(local_238);
            uVar4 = (uint)sVar6 - 2;
            if (local_238[1] != 'x' || local_238[0] != (vector<int,std::allocator<int>>)0x30) {
              uVar4 = (uint)sVar6;
            }
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar4 + 1;
              uVar8 = 0;
              do {
                bVar1 = local_248[uVar7 + 0xe];
                bVar2 = (byte)uVar8;
                if ((uVar8 < 0x400 & bVar1) == 1) {
                  *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) =
                       *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) | 1L << (bVar2 & 0x3c);
                }
                if ((bVar1 >> 1 & uVar8 < 0x400) == 1) {
                  *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) =
                       *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) | 2L << (bVar2 & 0x3c);
                }
                if ((bVar1 >> 2 & uVar8 < 0x400) == 1) {
                  *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) =
                       *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) | 4L << (bVar2 & 0x3c);
                }
                if ((bVar1 >> 3 & uVar8 < 0x400) == 1) {
                  *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) =
                       *(ulong *)(local_2b8 + (uVar8 >> 6) * 8) | 8L << (bVar2 & 0x3c);
                }
                uVar8 = uVar8 + 4;
                uVar7 = uVar7 - 1;
              } while (1 < uVar7);
            }
            uVar7 = 0;
            iVar3 = 0;
            iVar12 = 0;
            auVar11 = _DAT_00552350;
            do {
              uVar8 = *(ulong *)(local_2b8 + (uVar7 >> 6) * 8);
              auVar14 = auVar11 & _DAT_00552e60;
              auVar15._8_4_ = auVar14._8_4_;
              auVar15._12_4_ = auVar14._12_4_;
              auVar15._0_8_ = auVar14._8_8_;
              auVar13._8_4_ = (int)uVar8;
              auVar13._0_8_ = uVar8;
              auVar13._12_4_ = (int)(uVar8 >> 0x20);
              uVar8 = 1L << auVar14._0_8_ & uVar8;
              uVar16 = 1L << auVar15._8_8_ & auVar13._8_8_;
              iVar3 = (iVar3 - (uint)((int)uVar8 == 0 && (int)(uVar8 >> 0x20) == 0)) + 1;
              iVar12 = (iVar12 - (uint)((int)uVar16 == 0 && (int)(uVar16 >> 0x20) == 0)) + 1;
              uVar7 = uVar7 + 2;
              lVar9 = auVar11._8_8_;
              auVar11._0_8_ = auVar11._0_8_ + 2;
              auVar11._8_8_ = lVar9 + 2;
            } while (uVar7 != 0x400);
            if (iVar12 + iVar3 != 1) {
              local_238 = (undefined1  [16])0x0;
              local_228 = (int *)0x0;
              if (g_cpucount < 1) {
                iVar3 = 0;
              }
              else {
                uVar7 = 0;
                iVar3 = 0;
                iVar12 = g_cpucount;
                do {
                  if (((uVar7 < 0x400) &&
                      ((*(ulong *)(local_2b8 + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0)) &&
                     (local_2bc = get_thread_siblings((int)uVar7), iVar12 = g_cpucount,
                     local_2bc != -1)) {
                    if (local_238._8_8_ - local_238._0_8_ != 0) {
                      lVar9 = (long)(local_238._8_8_ - local_238._0_8_) >> 2;
                      lVar10 = 0;
                      do {
                        if (*(int *)(local_238._0_8_ + lVar10 * 4) == local_2bc) goto LAB_00172eb6;
                        lVar10 = lVar10 + 1;
                      } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
                    }
                    if ((int *)local_238._8_8_ == local_228) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)local_238,
                                 (iterator)local_238._8_8_,&local_2bc);
                    }
                    else {
                      *(int *)local_238._8_8_ = local_2bc;
                      local_238._8_8_ = (int *)(local_238._8_8_ + 4);
                    }
                    iVar3 = iVar3 + 1;
                    iVar12 = g_cpucount;
                  }
LAB_00172eb6:
                  uVar7 = uVar7 + 1;
                } while ((long)uVar7 < (long)iVar12);
                if ((void *)local_238._0_8_ != (void *)0x0) {
                  operator_delete((void *)local_238._0_8_,(long)local_228 - local_238._0_8_);
                }
              }
              uVar4 = (int)local_2c4 / iVar3 + 3;
              local_2c4 = (int)local_2c4 / iVar3 + 6;
              if (-1 < (int)uVar4) {
                local_2c4 = uVar4;
              }
              local_2c4 = local_2c4 & 0xfffffffc;
            }
            return local_2c4 << 10;
          }
        }
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/level",cpuid,uVar7);
      pFVar5 = fopen(local_138,"rb");
    } while (pFVar5 != (FILE *)0x0);
  }
  return 0;
}

Assistant:

static int get_data_cache_size(int cpuid, int level)
{
    char path[256];

    // discover sysfs cache entry
    int indexid = -1;
    for (int i = 0;; i++)
    {
        // check level
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/level", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            int cache_level = -1;
            int nscan = fscanf(fp, "%d", &cache_level);
            fclose(fp);
            if (nscan != 1 || cache_level != level)
                continue;
        }

        // check type
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/type", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            char type[32];
            int nscan = fscanf(fp, "%31s", type);
            fclose(fp);
            if (nscan != 1 || (strcmp(type, "Data") != 0 && strcmp(type, "Unified") != 0))
                continue;
        }

        indexid = i;
        break;
    }

    if (indexid == -1)
    {
        // no sysfs entry
        return 0;
    }

    // get size
    int cache_size_K = 0;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/size", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        int nscan = fscanf(fp, "%dK", &cache_size_K);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf cache_size_K error %d", nscan);
            return 0;
        }
    }

    // parse shared_cpu_map mask
    ncnn::CpuSet shared_cpu_map;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        char shared_cpu_map_str[256];
        int nscan = fscanf(fp, "%255s", shared_cpu_map_str);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf shared_cpu_map error %d", nscan);
            return 0;
        }

        int len = strlen(shared_cpu_map_str);

        if (shared_cpu_map_str[0] == '0' && shared_cpu_map_str[1] == 'x')
        {
            // skip leading 0x
            len -= 2;
        }

        int ci = 0;
        for (int i = len - 1; i >= 0; i--)
        {
            char x = shared_cpu_map_str[i];
            if (x & 1) shared_cpu_map.enable(ci + 0);
            if (x & 2) shared_cpu_map.enable(ci + 1);
            if (x & 4) shared_cpu_map.enable(ci + 2);
            if (x & 8) shared_cpu_map.enable(ci + 3);

            ci += 4;
        }
    }

    if (shared_cpu_map.num_enabled() == 1)
        return cache_size_K * 1024;

    // resolve physical cpu count in the shared_cpu_map
    int shared_physical_cpu_count = 0;
    {
        std::vector<int> thread_set;
        for (int i = 0; i < g_cpucount; i++)
        {
            if (!shared_cpu_map.is_enabled(i))
                continue;

            int thread_siblings = get_thread_siblings(i);
            if (thread_siblings == -1)
            {
                // ignore malformed one
                continue;
            }

            bool thread_siblings_exists = false;
            for (size_t j = 0; j < thread_set.size(); j++)
            {
                if (thread_set[j] == thread_siblings)
                {
                    thread_siblings_exists = true;
                    break;
                }
            }

            if (!thread_siblings_exists)
            {
                thread_set.push_back(thread_siblings);
                shared_physical_cpu_count++;
            }
        }
    }

    // return per-physical-core cache size with 4K aligned
    cache_size_K = (cache_size_K / shared_physical_cpu_count + 3) / 4 * 4;

    return cache_size_K * 1024;
}